

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  int iVar1;
  int *in_RSI;
  FuncState *in_RDI;
  FuncState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  luaK_exp2val((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (expdesc *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar1 = *in_RSI;
  if (2 < iVar1 - 1U) {
    if (iVar1 == 4) {
      if (in_RSI[2] < 0x100) {
        return in_RSI[2] | 0x100;
      }
      goto LAB_00117526;
    }
    if (iVar1 != 5) goto LAB_00117526;
  }
  if (in_RDI->nk < 0x100) {
    if (*in_RSI == 1) {
      iVar1 = nilK(unaff_retaddr);
    }
    else if (*in_RSI == 5) {
      iVar1 = luaK_numberK(in_RDI,(lua_Number)in_RSI);
    }
    else {
      iVar1 = boolK(in_RDI,(int)((ulong)in_RSI >> 0x20));
    }
    in_RSI[2] = iVar1;
    *in_RSI = 4;
    return in_RSI[2] | 0x100;
  }
LAB_00117526:
  iVar1 = luaK_exp2anyreg((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                          ,(expdesc *)0x117535);
  return iVar1;
}

Assistant:

static int luaK_exp2RK(FuncState*fs,expdesc*e){
luaK_exp2val(fs,e);
switch(e->k){
case VKNUM:
case VTRUE:
case VFALSE:
case VNIL:{
if(fs->nk<=((1<<(9-1))-1)){
e->u.s.info=(e->k==VNIL)?nilK(fs):
(e->k==VKNUM)?luaK_numberK(fs,e->u.nval):
boolK(fs,(e->k==VTRUE));
e->k=VK;
return RKASK(e->u.s.info);
}
else break;
}
case VK:{
if(e->u.s.info<=((1<<(9-1))-1))
return RKASK(e->u.s.info);
else break;
}
default:break;
}
return luaK_exp2anyreg(fs,e);
}